

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

int canvas_open(_glist *x,char *name,char *ext,char *dirresult,char **nameresult,uint size,int bin)

{
  int iVar1;
  char *local_70;
  t_canvasopen co;
  int fd;
  uint size_local;
  char **nameresult_local;
  char *dirresult_local;
  char *ext_local;
  char *name_local;
  _glist *x_local;
  
  co.fd = -1;
  co._44_4_ = size;
  iVar1 = sys_open_absolute(name,ext,dirresult,nameresult,size,bin,&co.fd);
  if (iVar1 == 0) {
    co.nameresult._0_4_ = co._44_4_;
    co.nameresult._4_4_ = bin;
    co.size = 0xffffffff;
    local_70 = name;
    co.name = ext;
    co.ext = dirresult;
    co.dirresult = (char *)nameresult;
    canvas_path_iterate(x,canvas_open_iter,&local_70);
    x_local._4_4_ = co.size;
  }
  else {
    x_local._4_4_ = co.fd;
  }
  return x_local._4_4_;
}

Assistant:

int canvas_open(const t_canvas *x, const char *name, const char *ext,
    char *dirresult, char **nameresult, unsigned int size, int bin)
{
    int fd = -1;
    t_canvasopen co;

        /* first check if "name" is absolute (and if so, try to open) */
    if (sys_open_absolute(name, ext, dirresult, nameresult, size, bin, &fd))
        return (fd);

        /* otherwise "name" is relative; iterate over all the search-paths */
    co.name = name;
    co.ext = ext;
    co.dirresult = dirresult;
    co.nameresult = nameresult;
    co.size = size;
    co.bin = bin;
    co.fd = -1;

    canvas_path_iterate(x, (t_canvas_path_iterator)canvas_open_iter, &co);

    return (co.fd);
}